

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FloorCaseInstance::compare
          (FloorCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  uint uVar8;
  ostringstream *poVar9;
  deUint32 aBits;
  uint uVar10;
  ulong uVar11;
  deUint32 u32;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar8 - 1 < 2) {
    if ((int)uVar5 < 1) {
      return true;
    }
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar11 = 0;
    do {
      local_34.value = floorf(*(float *)((long)pvVar3 + uVar11 * 4));
      fVar15 = *(float *)((long)pvVar4 + uVar11 * 4);
      uVar10 = (int)local_34.value - (int)fVar15;
      if ((uint)local_34.value < (uint)fVar15) {
        uVar10 = -((int)local_34.value - (int)fVar15);
      }
      if (uVar10 != 0) {
        poVar9 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"Expected [",10);
        poVar7 = (ostream *)std::ostream::operator<<(poVar9,(int)uVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
        poVar7 = anon_unknown_0::operator<<(poVar7,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
LAB_0083ecc4:
        local_40.value = (deUint64)uVar10;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar7);
        return false;
      }
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  else {
    uVar8 = -1 << (0x17 - (&DAT_00b5b32c)[(ulong)uVar8 * 4] & 0x1f);
    if ((int)uVar5 < 1) {
      return true;
    }
    uVar10 = ~uVar8;
    fVar15 = (float)(uVar8 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar11 = 0;
    do {
      fVar13 = *(float *)((long)pvVar3 + uVar11 * 4);
      fVar1 = *(float *)((long)pvVar4 + uVar11 * 4);
      fVar12 = floorf(fVar13 - fVar15);
      fVar13 = floorf(fVar13 + fVar15);
      iVar6 = (int)fVar12;
      while( true ) {
        if ((int)fVar13 < iVar6) {
          poVar9 = &(this->super_CommonFunctionTestInstance).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar9,"Expected [",10);
          poVar7 = (ostream *)std::ostream::operator<<(poVar9,(int)uVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = [",5);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)fVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)fVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] with ULP threshold ",0x15);
          goto LAB_0083ecc4;
        }
        fVar14 = (float)iVar6;
        uVar8 = (int)fVar14 - (int)fVar1;
        if ((uint)fVar14 < (uint)fVar1) {
          uVar8 = -((int)fVar14 - (int)fVar1);
        }
        if (uVar8 <= uVar10) break;
        iVar6 = iVar6 + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar5);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatFloor(in0);

				const deUint32	ulpDiff		= getUlpDiff(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatFloor(in0-eps));
				const int		maxRes		= int(deFloatFloor(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiff(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}